

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,Symbol*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::HashedEntry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key,Symbol **value)

{
  Type *pTVar1;
  undefined8 *puVar2;
  char16_t *pcVar3;
  Type pHVar4;
  Type piVar5;
  code *pcVar6;
  long *plVar7;
  bool bVar8;
  hash_t hVar9;
  hash_t hVar10;
  int iVar11;
  undefined4 *puVar12;
  uint uVar13;
  long lVar14;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *pBVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  CharacterBuffer<char16_t> local_60;
  hash_t local_4c;
  long *local_48;
  uint local_40;
  hash_t local_3c;
  BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *local_38;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  hVar9 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)key);
  local_3c = hVar9 * 2 + 1;
  local_4c = PrimePolicy::ModPrime(hVar9 & 0x7fffffff,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar16 = *(uint *)(lVar14 + (ulong)local_4c * 4);
  local_38 = (BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar16 < 0) {
    uVar13 = 0;
  }
  else {
    lVar14 = *(long *)(this + 8);
    uVar13 = 0;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      lVar18 = (ulong)uVar16 * 0x10;
      local_48 = (long *)(lVar14 + lVar18);
      puVar2 = *(undefined8 **)(lVar14 + lVar18);
      pcVar3 = (char16_t *)*puVar2;
      local_40 = uVar13;
      Memory::Recycler::WBSetBit((char *)&local_60);
      local_60.string.ptr = pcVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
      local_60.len = *(Type *)(puVar2 + 1);
      hVar10 = CharacterBuffer::operator_cast_to_unsigned_int((CharacterBuffer *)&local_60);
      hVar10 = hVar10 * 2 + 1;
      if (hVar10 != *(hash_t *)(lVar14 + 0xc + lVar18)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar12 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                           ,199,
                           "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                           ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
        if (!bVar8) goto LAB_008a156c;
        *puVar12 = 0;
        hVar10 = *(hash_t *)((long)local_48 + 0xc);
      }
      plVar7 = local_48;
      if (hVar10 == local_3c) {
        puVar2 = (undefined8 *)*local_48;
        pcVar3 = (char16_t *)*puVar2;
        Memory::Recycler::WBSetBit((char *)&local_60);
        local_60.string.ptr = pcVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
        local_60.len = *(Type *)(puVar2 + 1);
        bVar8 = CharacterBuffer<char16_t>::operator==(&local_60,key);
        if (bVar8) {
          if (local_38->stats == (DictionaryStats *)0x0) {
            return -1;
          }
          DictionaryStats::Lookup(local_38->stats,local_40);
          return -1;
        }
      }
      uVar13 = local_40 + 1;
      uVar16 = *(uint *)(plVar7 + 1);
    } while (-1 < (int)uVar16);
  }
  if (local_38->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_38->stats,uVar13);
  }
  pBVar15 = local_38;
  hVar10 = local_4c;
  if (local_38->freeCount == 0) {
    iVar11 = local_38->size;
    iVar17 = local_38->count;
    if (iVar17 == iVar11) {
      BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
      ::Resize(local_38);
      hVar10 = PrimePolicy::ModPrime
                         (hVar9 & 0x7fffffff,pBVar15->bucketCount,pBVar15->modFunctionIndex);
      iVar11 = pBVar15->size;
      iVar17 = pBVar15->count;
    }
    pBVar15->count = iVar17 + 1;
    if (iVar11 < iVar17 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar8) goto LAB_008a156c;
      *puVar12 = 0;
      iVar11 = local_38->size;
      pBVar15 = local_38;
    }
    if (iVar11 <= iVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar8) goto LAB_008a156c;
      *puVar12 = 0;
      pBVar15 = local_38;
    }
  }
  else {
    if (local_38->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar8) goto LAB_008a156c;
      *puVar12 = 0;
    }
    iVar17 = local_38->freeList;
    if (iVar17 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar8) goto LAB_008a156c;
      *puVar12 = 0;
      iVar17 = local_38->freeList;
    }
    if (local_38->count <= iVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar8) {
LAB_008a156c:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar12 = 0;
      iVar17 = local_38->freeList;
    }
    pBVar15 = local_38;
    pTVar1 = &local_38->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar11 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
               ::GetNextFreeEntryIndex(local_38->entries + iVar17);
      pBVar15->freeList = iVar11;
    }
  }
  pHVar4 = pBVar15->entries;
  *(Symbol **)
   &pHVar4[iVar17].
    super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
       = *value;
  pHVar4[iVar17].
  super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .hashCode = local_3c;
  piVar5 = pBVar15->buckets;
  *(int *)&pHVar4[iVar17].
           super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
           .field_0x8 = piVar5[hVar10];
  piVar5[hVar10] = iVar17;
  uVar13 = 0;
  iVar11 = iVar17;
  do {
    iVar11 = *(int *)&pHVar4[iVar11].
                      super_CacheHashedEntry<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                      .field_0x8;
    uVar13 = uVar13 + 1;
  } while (iVar11 != -1);
  if (pBVar15->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(pBVar15->stats,uVar13);
  }
  return iVar17;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }